

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O0

value_type * __thiscall
entt::basic_storage<entt::entity,Components::Transform,std::allocator<Components::Transform>,void>::
emplace<Components::Transform_const&>
          (basic_storage<entt::entity,Components::Transform,std::allocator<Components::Transform>,void>
           *this,entity_type entt,Transform *args)

{
  char *pos_00;
  value_type ptr;
  char *pcVar1;
  int __c;
  value_type elem;
  size_type pos;
  Transform *args_local;
  entity_type entt_local;
  basic_storage<entt::entity,_Components::Transform,_std::allocator<Components::Transform>,_void>
  *this_local;
  
  pos_00 = (char *)basic_sparse_set<entt::entity,_std::allocator<entt::entity>_>::slot
                             ((basic_sparse_set<entt::entity,_std::allocator<entt::entity>_> *)this)
  ;
  ptr = basic_storage<entt::entity,_Components::Transform,_std::allocator<Components::Transform>,_void>
        ::assure_at_least((basic_storage<entt::entity,_Components::Transform,_std::allocator<Components::Transform>,_void>
                           *)this,(size_t)pos_00);
  construct<Components::Transform_const&>(this,ptr,args);
  basic_sparse_set<entt::entity,_std::allocator<entt::entity>_>::try_emplace
            ((basic_sparse_set<entt::entity,_std::allocator<entt::entity>_> *)this,entt,(void *)0x0)
  ;
  pcVar1 = basic_sparse_set<entt::entity,_std::allocator<entt::entity>_>::index
                     ((basic_sparse_set<entt::entity,_std::allocator<entt::entity>_> *)this,
                      (char *)(ulong)entt,__c);
  if (pos_00 == pcVar1) {
    return ptr;
  }
  __assert_fail("pos == base_type::index(entt)",
                "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/entt/./single_include/entt/entt.hpp"
                ,0x409d,
                "value_type &entt::basic_storage<entt::entity, Components::Transform>::emplace(const entity_type, Args &&...) [Entity = entt::entity, Type = Components::Transform, Allocator = std::allocator<Components::Transform>, Args = <const Components::Transform &>]"
               );
}

Assistant:

value_type &emplace(const entity_type entt, Args &&...args) {
        const auto pos = base_type::slot();
        auto elem = assure_at_least(pos);
        construct(elem, std::forward<Args>(args)...);

        ENTT_TRY {
            base_type::try_emplace(entt);
            ENTT_ASSERT(pos == base_type::index(entt), "Misplaced component");
        }